

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

void __thiscall Jinx::Variant::SetString(Variant *this,WString *value)

{
  String local_30;
  
  Impl::ConvertWStringToUtf8(&local_30,value);
  Destroy(this);
  this->m_type = String;
  (this->field_1).m_collection.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)((long)&this->field_1 + 0x10);
  (this->field_1).m_string._M_string_length = 0;
  *(undefined1 *)((long)&this->field_1 + 0x10) = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
            (&(this->field_1).m_string,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    MemFree(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline_t void Variant::SetString(const WString & value)
	{
		SetString(Impl::ConvertWStringToUtf8(value));
	}